

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssp_blas2.c
# Opt level: O0

int sp_sgemv(char *trans,float alpha,SuperMatrix *A,float *x,int incx,float beta,float *y,int incy)

{
  float fVar1;
  int iVar2;
  bool bVar3;
  char local_298 [8];
  char msg_1 [256];
  char msg [256];
  int local_88;
  int notran;
  int_t j;
  int_t i;
  int irow;
  int ky;
  int kx;
  int jy;
  int jx;
  int iy;
  int leny;
  int lenx;
  float temp;
  int info;
  float *Aval;
  NCformat *Astore;
  float *pfStack_40;
  int incy_local;
  float *y_local;
  float beta_local;
  int incx_local;
  float *x_local;
  SuperMatrix *A_local;
  char *pcStack_18;
  float alpha_local;
  char *trans_local;
  
  Astore._4_4_ = incy;
  pfStack_40 = y;
  y_local._0_4_ = beta;
  y_local._4_4_ = incx;
  _beta_local = x;
  x_local = (float *)A;
  A_local._4_4_ = alpha;
  pcStack_18 = trans;
  iVar2 = strncmp(trans,"N",1);
  bVar3 = true;
  if (iVar2 != 0) {
    iVar2 = strncmp(pcStack_18,"n",1);
    bVar3 = iVar2 == 0;
  }
  Aval = *(float **)(x_local + 6);
  _temp = *(long *)(Aval + 2);
  lenx = 0;
  if (((bVar3) || (iVar2 = strncmp(pcStack_18,"T",1), iVar2 == 0)) ||
     (iVar2 = strncmp(pcStack_18,"C",1), iVar2 == 0)) {
    if (((int)x_local[3] < 0) || ((int)x_local[4] < 0)) {
      lenx = 3;
    }
    else if (y_local._4_4_ == 0) {
      lenx = 5;
    }
    else if (Astore._4_4_ == 0) {
      lenx = 8;
    }
  }
  else {
    lenx = 1;
  }
  if (lenx == 0) {
    if (((x_local[3] != 0.0) && (x_local[4] != 0.0)) &&
       ((A_local._4_4_ != 0.0 ||
        (((NAN(A_local._4_4_) || (y_local._0_4_ != 1.0)) || (NAN(y_local._0_4_))))))) {
      iVar2 = strncmp(pcStack_18,"N",1);
      if (iVar2 == 0) {
        iy = (int)x_local[4];
        jx = (int)x_local[3];
      }
      else {
        iy = (int)x_local[3];
        jx = (int)x_local[4];
      }
      if (y_local._4_4_ < 1) {
        irow = -(iy + -1) * y_local._4_4_;
      }
      else {
        irow = 0;
      }
      if (Astore._4_4_ < 1) {
        i = -(jx + -1) * Astore._4_4_;
      }
      else {
        i = 0;
      }
      if ((y_local._0_4_ != 1.0) || (NAN(y_local._0_4_))) {
        if (Astore._4_4_ == 1) {
          if ((y_local._0_4_ != 0.0) || (NAN(y_local._0_4_))) {
            for (notran = 0; notran < jx; notran = notran + 1) {
              pfStack_40[notran] = y_local._0_4_ * pfStack_40[notran];
            }
          }
          else {
            for (notran = 0; notran < jx; notran = notran + 1) {
              pfStack_40[notran] = 0.0;
            }
          }
        }
        else {
          jy = i;
          if ((y_local._0_4_ != 0.0) || (NAN(y_local._0_4_))) {
            for (notran = 0; notran < jx; notran = notran + 1) {
              pfStack_40[jy] = y_local._0_4_ * pfStack_40[jy];
              jy = Astore._4_4_ + jy;
            }
          }
          else {
            for (notran = 0; notran < jx; notran = notran + 1) {
              pfStack_40[jy] = 0.0;
              jy = Astore._4_4_ + jy;
            }
          }
        }
      }
      if ((A_local._4_4_ != 0.0) || (NAN(A_local._4_4_))) {
        if (bVar3) {
          kx = irow;
          if (Astore._4_4_ == 1) {
            for (local_88 = 0; local_88 < (int)x_local[4]; local_88 = local_88 + 1) {
              if ((_beta_local[kx] != 0.0) || (NAN(_beta_local[kx]))) {
                fVar1 = _beta_local[kx];
                for (notran = *(int *)(*(long *)(Aval + 6) + (long)local_88 * 4);
                    notran < *(int *)(*(long *)(Aval + 6) + (long)(local_88 + 1) * 4);
                    notran = notran + 1) {
                  iVar2 = *(int *)(*(long *)(Aval + 4) + (long)notran * 4);
                  pfStack_40[iVar2] =
                       A_local._4_4_ * fVar1 * *(float *)(_temp + (long)notran * 4) +
                       pfStack_40[iVar2];
                }
              }
              kx = y_local._4_4_ + kx;
            }
          }
          else {
            sprintf(msg_1 + 0xf8,"%s at line %d in file %s\n","Not implemented.",0x1ce,
                    "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/ssp_blas2.c"
                   );
            superlu_abort_and_exit(msg_1 + 0xf8);
          }
        }
        else {
          ky = i;
          if (y_local._4_4_ == 1) {
            for (local_88 = 0; local_88 < (int)x_local[4]; local_88 = local_88 + 1) {
              leny = 0;
              for (notran = *(int *)(*(long *)(Aval + 6) + (long)local_88 * 4);
                  notran < *(int *)(*(long *)(Aval + 6) + (long)(local_88 + 1) * 4);
                  notran = notran + 1) {
                leny = (int)(*(float *)(_temp + (long)notran * 4) *
                             _beta_local[*(int *)(*(long *)(Aval + 4) + (long)notran * 4)] +
                            (float)leny);
              }
              pfStack_40[ky] = A_local._4_4_ * (float)leny + pfStack_40[ky];
              ky = Astore._4_4_ + ky;
            }
          }
          else {
            sprintf(local_298,"%s at line %d in file %s\n","Not implemented.",0x1de,
                    "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/ssp_blas2.c"
                   );
            superlu_abort_and_exit(local_298);
          }
        }
      }
    }
  }
  else {
    input_error("sp_sgemv ",&lenx);
  }
  return 0;
}

Assistant:

int
sp_sgemv(char *trans, float alpha, SuperMatrix *A, float *x, 
	 int incx, float beta, float *y, int incy)
{
    /* Local variables */
    NCformat *Astore;
    float   *Aval;
    int info;
    float temp;
    int lenx, leny;
    int iy, jx, jy, kx, ky, irow;
    int_t i, j;
    int notran;

    notran = ( strncmp(trans, "N", 1)==0 || strncmp(trans, "n", 1)==0 );
    Astore = A->Store;
    Aval = Astore->nzval;
    
    /* Test the input parameters */
    info = 0;
    if ( !notran && strncmp(trans, "T", 1)!=0 && strncmp(trans, "C", 1)!=0 )
        info = 1;
    else if ( A->nrow < 0 || A->ncol < 0 ) info = 3;
    else if (incx == 0) info = 5;
    else if (incy == 0)	info = 8;
    if (info != 0) {
	input_error("sp_sgemv ", &info);
	return 0;
    }

    /* Quick return if possible. */
    if (A->nrow == 0 || A->ncol == 0 || (alpha == 0. && beta == 1.))
	return 0;

    /* Set  LENX  and  LENY, the lengths of the vectors x and y, and set 
       up the start points in  X  and  Y. */
    if (strncmp(trans, "N", 1)==0) {
	lenx = A->ncol;
	leny = A->nrow;
    } else {
	lenx = A->nrow;
	leny = A->ncol;
    }
    if (incx > 0) kx = 0;
    else kx =  - (lenx - 1) * incx;
    if (incy > 0) ky = 0;
    else ky =  - (leny - 1) * incy;

    /* Start the operations. In this version the elements of A are   
       accessed sequentially with one pass through A. */
    /* First form  y := beta*y. */
    if (beta != 1.) {
	if (incy == 1) {
	    if (beta == 0.)
		for (i = 0; i < leny; ++i) y[i] = 0.;
	    else
		for (i = 0; i < leny; ++i) y[i] = beta * y[i];
	} else {
	    iy = ky;
	    if (beta == 0.)
		for (i = 0; i < leny; ++i) {
		    y[iy] = 0.;
		    iy += incy;
		}
	    else
		for (i = 0; i < leny; ++i) {
		    y[iy] = beta * y[iy];
		    iy += incy;
		}
	}
    }
    
    if (alpha == 0.) return 0;

    if ( notran ) {
	/* Form  y := alpha*A*x + y. */
	jx = kx;
	if (incy == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		if (x[jx] != 0.) {
		    temp = alpha * x[jx];
		    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
			irow = Astore->rowind[i];
			y[irow] += temp * Aval[i];
		    }
		}
		jx += incx;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    } else {
	/* Form  y := alpha*A'*x + y. */
	jy = ky;
	if (incx == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		temp = 0.;
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    irow = Astore->rowind[i];
		    temp += Aval[i] * x[irow];
		}
		y[jy] += alpha * temp;
		jy += incy;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    }

    return 0;
}